

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

void absl::lts_20250127::str_format_internal::anon_unknown_0::RemoveExtraPrecision
               (size_t extra_digits,bool has_leftover_value,Buffer *out,int *exp_out)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  
  pcVar1 = out->end;
  pcVar2 = pcVar1 + -extra_digits;
  out->end = pcVar2;
  if ('5' < *pcVar2) goto LAB_0028c226;
  if (*pcVar2 != '5') {
    return;
  }
  if (has_leftover_value) goto LAB_0028c226;
  lVar4 = 1 - extra_digits;
  lVar8 = extra_digits - 4;
  lVar9 = extra_digits - 3;
  lVar5 = extra_digits - 2;
  for (lVar6 = (long)(extra_digits - 1) >> 2; 0 < lVar6; lVar6 = lVar6 + -1) {
    if (pcVar1[lVar4] != '0') {
      pcVar7 = pcVar1 + lVar4;
      goto LAB_0028c2c8;
    }
    if (pcVar1[lVar4 + 1] != '0') {
      pcVar7 = pcVar1 + -lVar5;
      goto LAB_0028c2c8;
    }
    if (pcVar1[lVar4 + 2] != '0') {
      pcVar7 = pcVar1 + -lVar9;
      goto LAB_0028c2c8;
    }
    if (pcVar1[lVar4 + 3] != '0') {
      pcVar7 = pcVar1 + -lVar8;
      goto LAB_0028c2c8;
    }
    lVar4 = lVar4 + 4;
    lVar8 = lVar8 + -4;
    lVar9 = lVar9 + -4;
    lVar5 = lVar5 + -4;
  }
  pcVar7 = pcVar1 + lVar4;
  if (lVar4 == -1) {
LAB_0028c307:
    if (*pcVar7 != '0') goto LAB_0028c2c8;
  }
  else {
    if (lVar4 == -3) {
      if (*pcVar7 == '0') {
        pcVar7 = pcVar1 + -lVar5;
        goto LAB_0028c2fe;
      }
    }
    else {
      if (lVar4 != -2) goto LAB_0028c2d1;
LAB_0028c2fe:
      if (*pcVar7 == '0') {
        pcVar7 = pcVar7 + 1;
        goto LAB_0028c307;
      }
    }
LAB_0028c2c8:
    if (pcVar7 != pcVar1) goto LAB_0028c226;
  }
LAB_0028c2d1:
  cVar3 = pcVar2[-1];
  if (cVar3 == '.') {
    cVar3 = pcVar2[-2];
  }
  if (((int)cVar3 & 0x80000001U) != 1) {
    return;
  }
LAB_0028c226:
  RoundUp<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
            (out,exp_out);
  return;
}

Assistant:

void RemoveExtraPrecision(size_t extra_digits,
                          bool has_leftover_value,
                          Buffer* out,
                          int* exp_out) {
  // Back out the extra digits
  out->end -= extra_digits;

  bool needs_to_round_up = [&] {
    // We look at the digit just past the end.
    // There must be 'extra_digits' extra valid digits after end.
    if (*out->end > '5') return true;
    if (*out->end < '5') return false;
    if (has_leftover_value || std::any_of(out->end + 1, out->end + extra_digits,
                                          [](char c) { return c != '0'; }))
      return true;

    // Ends in ...50*, round to even.
    return out->last_digit() % 2 == 1;
  }();

  if (needs_to_round_up) {
    RoundUp<FormatStyle::Precision>(out, exp_out);
  }
}